

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc.c
# Opt level: O1

void sc_import(limb_t *dst,uint8_t *src,size_t len)

{
  byte bVar1;
  bool bVar2;
  long lVar3;
  int iVar4;
  byte *pbVar5;
  ulong uVar6;
  int iVar7;
  lsc_t tmp;
  ulong local_58 [11];
  
  pbVar5 = src + len;
  lVar3 = 0;
  iVar7 = 0;
  uVar6 = 0;
  do {
    if ((src < pbVar5) && (iVar4 = iVar7, iVar7 < 0x34)) {
      do {
        bVar1 = *src;
        src = src + 1;
        uVar6 = (ulong)bVar1 << ((byte)iVar4 & 0x3f) | uVar6;
        iVar7 = iVar4 + 8;
        if (pbVar5 <= src) break;
        bVar2 = iVar4 < 0x2c;
        iVar4 = iVar7;
      } while (bVar2);
    }
    local_58[lVar3] = uVar6 & 0xfffffffffffff;
    uVar6 = uVar6 >> 0x34;
    iVar7 = iVar7 + -0x34;
    lVar3 = lVar3 + 1;
    if (lVar3 == 10) {
      sc_barrett(dst,(limb_t *)local_58);
      return;
    }
  } while( true );
}

Assistant:

void
sc_import(sc_t dst, const uint8_t *src, size_t len)
{
	const uint8_t *endp = src + len;
	lsc_t tmp;
	uint64_t foo;
	int i, fill;

	fill = 0;
	foo = 0;
	for (i = 0; i < 2*K; i++) {
		while (src < endp && fill < LB) {
			foo |= (uint64_t)*src++ << fill;
			fill += 8;
		}
		
		tmp[i] = foo & MSK;

		foo >>= LB;
		fill -= LB;
	}

	sc_barrett(dst, tmp);
}